

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

int Gia_NodeDeref_rec(Gia_Man_t *p,Gia_Obj_t *pNode)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  int iVar6;
  
  uVar2 = (uint)*(undefined8 *)pNode;
  if ((~uVar2 & 0x9fffffff) == 0) {
    return 0;
  }
  if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x439,"int Gia_NodeDeref_rec(Gia_Man_t *, Gia_Obj_t *)");
  }
  pGVar1 = pNode + -(ulong)(uVar2 & 0x1fffffff);
  pGVar4 = p->pObjs;
  if ((pGVar4 <= pGVar1) && (pGVar1 < pGVar4 + p->nObjs)) {
    iVar5 = (int)((ulong)((long)pGVar1 - (long)pGVar4) >> 2) * -0x55555555;
    iVar6 = p->pRefs[iVar5];
    if (iVar6 < 1) {
      __assert_fail("Gia_ObjRefNum(p, pFanin) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                    ,0x43b,"int Gia_NodeDeref_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar3 = 0;
    iVar6 = iVar6 + -1;
    p->pRefs[iVar5] = iVar6;
    if (iVar6 == 0) {
      iVar3 = Gia_NodeDeref_rec(p,pGVar1);
      pGVar4 = p->pObjs;
    }
    pGVar1 = pNode + -(ulong)(*(uint *)&pNode->field_0x4 & 0x1fffffff);
    if ((pGVar4 <= pGVar1) && (pGVar1 < pGVar4 + p->nObjs)) {
      iVar5 = (int)((ulong)((long)pGVar1 - (long)pGVar4) >> 2) * -0x55555555;
      iVar6 = p->pRefs[iVar5];
      if (0 < iVar6) {
        iVar6 = iVar6 + -1;
        p->pRefs[iVar5] = iVar6;
        if (iVar6 == 0) {
          iVar6 = Gia_NodeDeref_rec(p,pGVar1);
          iVar3 = iVar3 + iVar6;
        }
        return iVar3 + 1;
      }
      __assert_fail("Gia_ObjRefNum(p, pFanin) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                    ,0x43f,"int Gia_NodeDeref_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Gia_NodeDeref_rec( Gia_Man_t * p, Gia_Obj_t * pNode )
{
    Gia_Obj_t * pFanin;
    int Counter = 0;
    if ( Gia_ObjIsCi(pNode) )
        return 0;
    assert( Gia_ObjIsAnd(pNode) );
    pFanin = Gia_ObjFanin0(pNode);
    assert( Gia_ObjRefNum(p, pFanin) > 0 );
    if ( Gia_ObjRefDec(p, pFanin) == 0 )
        Counter += Gia_NodeDeref_rec( p, pFanin );
    pFanin = Gia_ObjFanin1(pNode);
    assert( Gia_ObjRefNum(p, pFanin) > 0 );
    if ( Gia_ObjRefDec(p, pFanin) == 0 )
        Counter += Gia_NodeDeref_rec( p, pFanin );
    return Counter + 1;
}